

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

void satoko_assump_push(solver_t *s,int lit)

{
  vec_char_t *p;
  char value;
  uint uVar1;
  uint uVar2;
  int lit_local;
  solver_t *s_local;
  
  uVar1 = lit2var(lit);
  uVar2 = satoko_varnum(s);
  if (uVar1 < uVar2) {
    vec_uint_push_back(s->assumptions,lit);
    p = s->polarity;
    uVar1 = lit2var(lit);
    value = lit_polarity(lit);
    vec_char_assign(p,uVar1,value);
    return;
  }
  __assert_fail("lit2var(lit) < (unsigned)satoko_varnum(s)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver_api.c"
                ,300,"void satoko_assump_push(solver_t *, int)");
}

Assistant:

void satoko_assump_push(solver_t *s, int lit)
{
    assert(lit2var(lit) < (unsigned)satoko_varnum(s));
    // printf("[Satoko] Push assumption: %d\n", lit);
    vec_uint_push_back(s->assumptions, lit);
    vec_char_assign(s->polarity, lit2var(lit), lit_polarity(lit));
}